

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool __thiscall
chaiscript::detail::Dispatch_Engine::is_type
          (Dispatch_Engine *this,Boxed_Value *r,string_view user_typename)

{
  bool bVar1;
  int iVar2;
  Dynamic_Object *pDVar3;
  size_t __n;
  size_type __rlen;
  bool bVar4;
  Type_Info local_38;
  
  __n = user_typename._M_len;
  get_type(&local_38,this,user_typename,true);
  bVar1 = Type_Info::bare_equal
                    (&local_38,
                     &((r->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info);
  bVar4 = true;
  if (!bVar1) {
    local_38.m_bare_type_info =
         (type_info *)Type_Conversions::conversion_saves(&this->m_conversions);
    local_38.m_type_info = (type_info *)&this->m_conversions;
    pDVar3 = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>
                       (r,(Type_Conversions_State *)&local_38);
    if ((pDVar3->m_type_name)._M_string_length == __n) {
      if (__n == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(user_typename._M_str,(pDVar3->m_type_name)._M_dataplus._M_p,__n);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool is_type(const Boxed_Value &r, std::string_view user_typename) const noexcept {
        try {
          if (get_type(user_typename).bare_equal(r.get_type_info())) {
            return true;
          }
        } catch (const std::range_error &) {
        }

        try {
          const dispatch::Dynamic_Object &d = boxed_cast<const dispatch::Dynamic_Object &>(r);
          return d.get_type_name() == user_typename;
        } catch (const std::bad_cast &) {
        }

        return false;
      }